

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcoefct.c
# Opt level: O0

int consume_data(j_decompress_ptr cinfo)

{
  int iVar1;
  jpeg_d_coef_controller *pjVar2;
  jpeg_component_info *pjVar3;
  boolean bVar4;
  uint uVar5;
  JBLOCKARRAY ppaJVar6;
  jpeg_component_info *compptr;
  JBLOCKROW buffer_ptr;
  JBLOCKARRAY buffer [4];
  int local_38;
  JDIMENSION start_col;
  int yoffset;
  int yindex;
  int xindex;
  int ci;
  int blkn;
  JDIMENSION MCU_col_num;
  my_coef_ptr coef;
  j_decompress_ptr cinfo_local;
  
  pjVar2 = cinfo->coef;
  for (yindex = 0; yindex < cinfo->comps_in_scan; yindex = yindex + 1) {
    pjVar3 = cinfo->cur_comp_info[yindex];
    ppaJVar6 = (*cinfo->mem->access_virt_barray)
                         ((j_common_ptr)cinfo,
                          (jvirt_barray_ptr)(&pjVar2[3].start_output_pass)[pjVar3->component_index],
                          cinfo->input_iMCU_row * pjVar3->v_samp_factor,pjVar3->v_samp_factor,1);
    buffer[(long)yindex + -1] = ppaJVar6;
  }
  local_38 = *(int *)((long)&pjVar2[1].start_input_pass + 4);
  do {
    if (*(int *)&pjVar2[1].consume_data <= local_38) {
      uVar5 = cinfo->input_iMCU_row + 1;
      cinfo->input_iMCU_row = uVar5;
      if (uVar5 < cinfo->total_iMCU_rows) {
        start_iMCU_row(cinfo);
        cinfo_local._4_4_ = 3;
      }
      else {
        (*cinfo->inputctl->finish_input_pass)(cinfo);
        cinfo_local._4_4_ = 4;
      }
      return cinfo_local._4_4_;
    }
    for (ci = *(int *)&pjVar2[1].start_input_pass; (uint)ci < cinfo->MCUs_per_row; ci = ci + 1) {
      xindex = 0;
      for (yindex = 0; yindex < cinfo->comps_in_scan; yindex = yindex + 1) {
        pjVar3 = cinfo->cur_comp_info[yindex];
        iVar1 = pjVar3->MCU_width;
        for (start_col = 0; (int)start_col < pjVar3->MCU_height; start_col = start_col + 1) {
          compptr = (jpeg_component_info *)
                    (buffer[(long)yindex + -1][(int)(start_col + local_38)] + (uint)(ci * iVar1));
          for (yoffset = 0; yoffset < pjVar3->MCU_width; yoffset = yoffset + 1) {
            (&pjVar2[1].start_output_pass)[xindex] = (_func_void_j_decompress_ptr *)compptr;
            compptr = (jpeg_component_info *)&compptr[1].height_in_blocks;
            xindex = xindex + 1;
          }
        }
      }
      bVar4 = (*cinfo->entropy->decode_mcu)(cinfo,(JBLOCKROW *)&pjVar2[1].start_output_pass);
      if (bVar4 == 0) {
        *(int *)((long)&pjVar2[1].start_input_pass + 4) = local_38;
        *(int *)&pjVar2[1].start_input_pass = ci;
        return 0;
      }
    }
    *(undefined4 *)&pjVar2[1].start_input_pass = 0;
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

METHODDEF(int)
consume_data (j_decompress_ptr cinfo)
{
  my_coef_ptr coef = (my_coef_ptr) cinfo->coef;
  JDIMENSION MCU_col_num;	/* index of current MCU within row */
  int blkn, ci, xindex, yindex, yoffset;
  JDIMENSION start_col;
  JBLOCKARRAY buffer[MAX_COMPS_IN_SCAN];
  JBLOCKROW buffer_ptr;
  jpeg_component_info *compptr;

  /* Align the virtual buffers for the components used in this scan. */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    buffer[ci] = (*cinfo->mem->access_virt_barray)
      ((j_common_ptr) cinfo, coef->whole_image[compptr->component_index],
       cinfo->input_iMCU_row * compptr->v_samp_factor,
       (JDIMENSION) compptr->v_samp_factor, TRUE);
    /* Note: entropy decoder expects buffer to be zeroed,
     * but this is handled automatically by the memory manager
     * because we requested a pre-zeroed array.
     */
  }

  /* Loop to process one whole iMCU row */
  for (yoffset = coef->MCU_vert_offset; yoffset < coef->MCU_rows_per_iMCU_row;
       yoffset++) {
    for (MCU_col_num = coef->MCU_ctr; MCU_col_num < cinfo->MCUs_per_row;
	 MCU_col_num++) {
      /* Construct list of pointers to DCT blocks belonging to this MCU */
      blkn = 0;			/* index of current DCT block within MCU */
      for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
	compptr = cinfo->cur_comp_info[ci];
	start_col = MCU_col_num * compptr->MCU_width;
	for (yindex = 0; yindex < compptr->MCU_height; yindex++) {
	  buffer_ptr = buffer[ci][yindex+yoffset] + start_col;
	  for (xindex = 0; xindex < compptr->MCU_width; xindex++) {
	    coef->MCU_buffer[blkn++] = buffer_ptr++;
	  }
	}
      }
      /* Try to fetch the MCU. */
      if (! (*cinfo->entropy->decode_mcu) (cinfo, coef->MCU_buffer)) {
	/* Suspension forced; update state counters and exit */
	coef->MCU_vert_offset = yoffset;
	coef->MCU_ctr = MCU_col_num;
	return JPEG_SUSPENDED;
      }
    }
    /* Completed an MCU row, but perhaps not an iMCU row */
    coef->MCU_ctr = 0;
  }
  /* Completed the iMCU row, advance counters for next one */
  if (++(cinfo->input_iMCU_row) < cinfo->total_iMCU_rows) {
    start_iMCU_row(cinfo);
    return JPEG_ROW_COMPLETED;
  }
  /* Completed the scan */
  (*cinfo->inputctl->finish_input_pass) (cinfo);
  return JPEG_SCAN_COMPLETED;
}